

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumValueOptions::InternalSwap(EnumValueOptions *this,EnumValueOptions *other)

{
  InternalMetadataWithArena *this_00;
  EnumValueOptions *other_local;
  EnumValueOptions *this_local;
  Container *local_30;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             &(other->uninterpreted_option_).super_RepeatedPtrFieldBase);
  std::swap<bool>(&this->deprecated_,&other->deprecated_);
  std::swap<unsigned_int>((this->_has_bits_).has_bits_,(other->_has_bits_).has_bits_);
  this_00 = &other->_internal_metadata_;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) != 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) != 1) goto LAB_0052ec7d;
  }
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
               ::
               PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                         ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                           *)this_00);
  }
  else {
    local_30 = (Container *)
               internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,&local_30->unknown_fields);
LAB_0052ec7d:
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  return;
}

Assistant:

void EnumValueOptions::InternalSwap(EnumValueOptions* other) {
  uninterpreted_option_.InternalSwap(&other->uninterpreted_option_);
  std::swap(deprecated_, other->deprecated_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
  _extensions_.Swap(&other->_extensions_);
}